

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O2

void __thiscall
spvtools::val::ValidationState_t::RegisterInstruction(ValidationState_t *this,Instruction *inst)

{
  uint16_t uVar1;
  uint32_t id;
  pointer psVar2;
  StorageClass storage_class;
  Instruction *this_00;
  size_t index;
  long lVar3;
  size_t i;
  ulong uVar4;
  
  if ((inst->inst_).result_id != 0) {
    std::
    _Hashtable<unsigned_int,std::pair<unsigned_int_const,spvtools::val::Instruction*>,std::allocator<std::pair<unsigned_int_const,spvtools::val::Instruction*>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<std::pair<unsigned_int,spvtools::val::Instruction*>>
              ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,spvtools::val::Instruction*>,std::allocator<std::pair<unsigned_int_const,spvtools::val::Instruction*>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&this->all_definitions_);
  }
  lVar3 = 4;
  uVar4 = 0;
  do {
    psVar2 = (inst->operands_).
             super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>._M_impl
             .super__Vector_impl_data._M_start;
    if ((ulong)((long)(inst->operands_).
                      super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)psVar2 >> 4) <= uVar4) {
      return;
    }
    if (*(int *)((long)&psVar2->offset + lVar3) - 1U < 2) {
      id = (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start[*(ushort *)((long)psVar2 + lVar3 + -4)];
      this_00 = FindDef(this,id);
      if (this_00 != (Instruction *)0x0) {
        if ((*(int *)((long)&psVar2->offset + lVar3) == 1) && ((this_00->inst_).opcode == 0x56)) {
          RegisterSampledImageConsumer(this,id,inst);
        }
        if (inst->function_ != (Function *)0x0) {
          uVar1 = (this_00->inst_).opcode;
          index = 1;
          if (uVar1 != 0x20) {
            if (uVar1 != 0x3b) goto LAB_005a48c8;
            index = 2;
          }
          storage_class = Instruction::GetOperandAs<spv::StorageClass>(this_00,index);
          RegisterStorageClassConsumer(this,storage_class,inst);
        }
      }
    }
LAB_005a48c8:
    uVar4 = uVar4 + 1;
    lVar3 = lVar3 + 0x10;
  } while( true );
}

Assistant:

void ValidationState_t::RegisterInstruction(Instruction* inst) {
  if (inst->id()) all_definitions_.insert(std::make_pair(inst->id(), inst));

  // Some validation checks are easier by getting all the consumers
  for (size_t i = 0; i < inst->operands().size(); ++i) {
    const spv_parsed_operand_t& operand = inst->operand(i);
    if ((SPV_OPERAND_TYPE_ID == operand.type) ||
        (SPV_OPERAND_TYPE_TYPE_ID == operand.type)) {
      const uint32_t operand_word = inst->word(operand.offset);
      Instruction* operand_inst = FindDef(operand_word);
      if (!operand_inst) {
        continue;
      }

      // If the instruction is using an OpTypeSampledImage as an operand, it
      // should be recorded. The validator will ensure that all usages of an
      // OpTypeSampledImage and its definition are in the same basic block.
      if ((SPV_OPERAND_TYPE_ID == operand.type) &&
          (spv::Op::OpSampledImage == operand_inst->opcode())) {
        RegisterSampledImageConsumer(operand_word, inst);
      }

      // In order to track storage classes (not Function) used per execution
      // model we can't use RegisterExecutionModelLimitation on instructions
      // like OpTypePointer which are going to be in the pre-function section.
      // Instead just need to register storage class usage for consumers in a
      // function block.
      if (inst->function()) {
        if (operand_inst->opcode() == spv::Op::OpTypePointer) {
          RegisterStorageClassConsumer(
              operand_inst->GetOperandAs<spv::StorageClass>(1), inst);
        } else if (operand_inst->opcode() == spv::Op::OpVariable) {
          RegisterStorageClassConsumer(
              operand_inst->GetOperandAs<spv::StorageClass>(2), inst);
        }
      }
    }
  }
}